

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O1

void anon_unknown.dwarf_2f4f9b::check<half>(istream *is,half c)

{
  float *pfVar1;
  float fVar2;
  ostream *poVar3;
  long *plVar4;
  uchar b [2];
  half local_1a;
  
  std::istream::read((char *)is,(long)&local_1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"4half",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": expected ",0xb);
  poVar3 = (ostream *)operator<<((ostream *)&std::cout,c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", got ",6);
  plVar4 = (long *)operator<<(poVar3,local_1a);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  fVar2 = *(float *)((long)&half::_toFloat + (ulong)c._h * 4);
  pfVar1 = (float *)((long)&half::_toFloat + (ulong)local_1a._h * 4);
  if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = half]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}